

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

int __thiscall
duckdb::Interpolator<false>::Interpolate<unsigned_long,int,duckdb::QuantileIndirect<int>>
          (Interpolator<false> *this,unsigned_long lidx,unsigned_long hidx,Vector *result,
          QuantileIndirect<int> *accessor)

{
  DataChunk *pDVar1;
  uint uVar2;
  CURSOR *pCVar3;
  int iVar4;
  bool bVar5;
  reference pvVar6;
  ulong uVar7;
  undefined1 auVar8 [12];
  int result_1;
  int local_54;
  string local_50;
  
  pCVar3 = accessor->data;
  uVar7 = (pCVar3->scan).current_row_index;
  bVar5 = (pCVar3->scan).next_row_index <= lidx;
  if (lidx == hidx) {
    if (lidx < uVar7 || bVar5) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
      uVar7 = (pCVar3->scan).current_row_index;
    }
    uVar2 = pCVar3->data[(uint)((int)lidx - (int)uVar7)];
    bVar5 = TryCast::Operation<int,int>(uVar2,&local_54,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
  }
  else {
    if (lidx < uVar7 || bVar5) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,lidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
      uVar7 = (pCVar3->scan).current_row_index;
    }
    uVar2 = pCVar3->data[(uint)((int)lidx - (int)uVar7)];
    bVar5 = TryCast::Operation<int,int>(uVar2,&local_54,false);
    iVar4 = local_54;
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    pCVar3 = accessor->data;
    uVar7 = (pCVar3->scan).current_row_index;
    if ((pCVar3->scan).next_row_index <= hidx || hidx < uVar7) {
      pDVar1 = &pCVar3->page;
      ColumnDataCollection::Seek(pCVar3->inputs,hidx,&pCVar3->scan,pDVar1);
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      pCVar3->data = (int *)pvVar6->data;
      pvVar6 = vector<duckdb::Vector,_true>::operator[](&pDVar1->data,0);
      FlatVector::VerifyFlatVector(pvVar6);
      pCVar3->validity = &pvVar6->validity;
      uVar7 = (pCVar3->scan).current_row_index;
    }
    uVar2 = pCVar3->data[(uint)((int)hidx - (int)uVar7)];
    bVar5 = TryCast::Operation<int,int>(uVar2,&local_54,false);
    if (!bVar5) {
      auVar8 = __cxa_allocate_exception(0x10);
      CastExceptionText<int,int>(&local_50,(duckdb *)(ulong)uVar2,auVar8._8_4_);
      InvalidInputException::InvalidInputException(auVar8._0_8_,(string *)&local_50);
      __cxa_throw(auVar8._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                 );
    }
    local_54 = (int)((double)(local_54 - iVar4) *
                     (this->RN -
                     (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                      1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0))) +
                    (double)iVar4);
  }
  return local_54;
}

Assistant:

TARGET_TYPE Interpolate(INPUT_TYPE lidx, INPUT_TYPE hidx, Vector &result, const ACCESSOR &accessor) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		if (lidx == hidx) {
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
		} else {
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(lidx), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(hidx), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}